

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O3

int traceback(lua_State *L)

{
  int iVar1;
  char *msg;
  
  iVar1 = lua_isstring(L,1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,1);
    if (iVar1 < 1) {
      return 1;
    }
    iVar1 = luaL_callmeta(L,1,"__tostring");
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      return 1;
    }
    lua_remove(L,1);
  }
  msg = lua_tolstring(L,1,(size_t *)0x0);
  luaL_traceback(L,L,msg,1);
  return 1;
}

Assistant:

static int traceback(lua_State *L)
{
  if (!lua_isstring(L, 1)) { /* Non-string error object? Try metamethod. */
    if (lua_isnoneornil(L, 1) ||
	!luaL_callmeta(L, 1, "__tostring") ||
	!lua_isstring(L, -1))
      return 1;  /* Return non-string error object. */
    lua_remove(L, 1);  /* Replace object by result of __tostring metamethod. */
  }
  luaL_traceback(L, L, lua_tostring(L, 1), 1);
  return 1;
}